

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argagg::option_results::as<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,option_results *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t
          )

{
  pointer poVar1;
  
  poVar1 = (this->all).
           super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (poVar1 == (this->all).
                super__Vector_base<argagg::option_result,_std::allocator<argagg::option_result>_>.
                _M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)t);
  }
  else {
    option_result::as<std::__cxx11::string>(__return_storage_ptr__,poVar1 + -1,t);
  }
  return __return_storage_ptr__;
}

Assistant:

T option_results::as(const T& t) const
{
  if (this->all.size() == 0) {
    return t;
  }
  return this->all.back().as<T>(t);
}